

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec75.c
# Opt level: O3

int Dau_DsdCheckDecExist_rec(char *pStr,char **p,int *pMatches,int *pnSupp)

{
  uint uVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ulong *pnSupp_00;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  byte *pbVar10;
  int pSupps [8];
  ulong local_58 [5];
  
  pbVar10 = (byte *)*p;
  bVar3 = *pbVar10;
  pbVar2 = pbVar10;
  if (bVar3 == 0x21) {
    pbVar2 = pbVar10 + 1;
    *p = (char *)pbVar2;
    bVar3 = pbVar10[1];
  }
  if ((byte)(bVar3 + 0xbf) < 6 || (byte)(bVar3 - 0x30) < 10) {
    do {
      pbVar2 = pbVar2 + 1;
      *p = (char *)pbVar2;
      bVar3 = *pbVar2;
    } while ((byte)(bVar3 - 0x30) < 10 || (byte)(bVar3 + 0xbf) < 6);
  }
  if ((byte)(bVar3 + 0x9f) < 0x1a) {
    *pnSupp = *pnSupp + 1;
    return 0;
  }
  uVar6 = (uint)bVar3;
  if (bVar3 < 0x5b) {
    if (uVar6 != 0x28) {
      if (uVar6 != 0x3c) {
LAB_0039b2e0:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                      ,0x65,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
      }
LAB_0039b1a0:
      if (uVar6 + 2 != (int)pStr[pMatches[(long)pbVar2 - (long)pStr]]) {
        __assert_fail("*q == **p + 1 + (**p != \'(\')",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                      ,0x5a,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
      }
      pbVar10 = (byte *)(pStr + pMatches[(long)pbVar2 - (long)pStr]);
      pbVar2 = pbVar2 + 1;
      *p = (char *)pbVar2;
      uVar6 = 0;
      if (pbVar2 < pbVar10) {
        uVar6 = 0;
        do {
          local_58[0] = local_58[0] & 0xffffffff00000000;
          uVar1 = Dau_DsdCheckDecExist_rec(pStr,p,pMatches,(int *)local_58);
          uVar6 = uVar6 | uVar1;
          *pnSupp = *pnSupp + (int)local_58[0];
          pbVar2 = (byte *)(*p + 1);
          *p = (char *)pbVar2;
        } while (pbVar2 < pbVar10);
      }
      if (pbVar2 == pbVar10) {
        return uVar6 | 1 << ((byte)*pnSupp & 0x1f);
      }
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                    ,0x61,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
    }
  }
  else {
    if (bVar3 == 0x7b) goto LAB_0039b1a0;
    if (uVar6 != 0x5b) goto LAB_0039b2e0;
  }
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  if ((uint)bVar3 + (uint)(bVar3 != 0x28) + 1 != (int)pStr[pMatches[(long)pbVar2 - (long)pStr]]) {
    __assert_fail("*q == **p + 1 + (**p != \'(\')",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                  ,0x40,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
  }
  pbVar10 = (byte *)(pStr + pMatches[(long)pbVar2 - (long)pStr]);
  pbVar2 = pbVar2 + 1;
  *p = (char *)pbVar2;
  if (pbVar2 < pbVar10) {
    lVar9 = 0;
    pnSupp_00 = local_58;
    uVar6 = 0;
    do {
      uVar1 = Dau_DsdCheckDecExist_rec(pStr,p,pMatches,(int *)pnSupp_00);
      *pnSupp = *pnSupp + (int)*pnSupp_00;
      uVar6 = uVar6 | uVar1;
      pbVar2 = (byte *)(*p + 1);
      *p = (char *)pbVar2;
      lVar9 = lVar9 + -1;
      pnSupp_00 = (ulong *)((long)pnSupp_00 + 4);
    } while (pbVar2 < pbVar10);
    if (pbVar2 != pbVar10) {
LAB_0039b2a2:
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                    ,0x46,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
    }
    if (lVar9 != -1) {
      uVar1 = 1;
      uVar5 = 1 << ((byte)-lVar9 & 0x1f);
      if ((int)uVar5 < 2) {
        return uVar6;
      }
      while( true ) {
        uVar8 = 0;
        uVar4 = 0;
        do {
          if ((uVar1 >> ((uint)uVar8 & 0x1f) & 1) != 0) {
            uVar4 = uVar4 + *(int *)((long)local_58 + uVar8 * 4);
          }
          uVar8 = uVar8 + 1;
        } while ((-lVar9 & 0xffffffffU) != uVar8);
        if (7 < uVar4 - 1) break;
        uVar7 = 1 << ((byte)uVar4 & 0x1f);
        if (uVar4 < 2) {
          uVar7 = 0;
        }
        uVar6 = uVar6 | uVar7;
        uVar1 = uVar1 + 1;
        if (uVar1 == uVar5) {
          return uVar6;
        }
      }
      __assert_fail("Sum > 0 && Sum <= 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                    ,0x4f,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
    }
  }
  else if (pbVar2 != pbVar10) goto LAB_0039b2a2;
  __assert_fail("nParts > 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                ,0x47,"int Dau_DsdCheckDecExist_rec(char *, char **, int *, int *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Finds all boundsets for which decomposition exists.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Dau_DsdCheckDecExist_rec( char * pStr, char ** p, int * pMatches, int * pnSupp )
{
    if ( **p == '!' )
        (*p)++;
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
        (*p)++;
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        (*pnSupp)++;
        return 0;
    }
    if ( **p == '(' || **p == '[' ) // and/xor
    {
        unsigned Mask = 0;
        int m, pSupps[8] = {0}, nParts = 0, nMints;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Mask |= Dau_DsdCheckDecExist_rec( pStr, p, pMatches, &pSupps[nParts] );
            *pnSupp += pSupps[nParts++];
        }
        assert( *p == q );
        assert( nParts > 1 );
        nMints = (1 << nParts);
        for ( m = 1; m < nMints; m++ )
        {
            int i, Sum = 0;
            for ( i = 0; i < nParts; i++ )
                if ( (m >> i) & 1 )
                    Sum += pSupps[i];
            assert( Sum > 0 && Sum <= 8 );
            if ( Sum >= 2 )
                Mask |= (1 << Sum);
        }
        return Mask;
    }
    if ( **p == '<' || **p == '{' ) // mux
    {
        int uSupp;
        unsigned Mask = 0;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            uSupp = 0;
            Mask |= Dau_DsdCheckDecExist_rec( pStr, p, pMatches, &uSupp );
            *pnSupp += uSupp;
        }
        assert( *p == q );
        Mask |= (1 << *pnSupp);
        return Mask;
    }
    assert( 0 );
    return 0;
}